

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O2

string * __thiscall
svg::Circle::toString_abi_cxx11_(string *__return_storage_ptr__,Circle *this,Layout *layout)

{
  double dVar1;
  ostream *poVar2;
  stringstream local_390 [8];
  stringstream ss;
  ostream local_380 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  double local_48;
  double local_40;
  double local_38;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  std::__cxx11::stringstream::stringstream(local_390);
  std::__cxx11::string::string((string *)&local_1e8,"circle",&local_2f);
  std::operator+(&local_68,"\t<",&local_1e8);
  std::operator+(&local_208,&local_68," ");
  std::__cxx11::string::~string((string *)&local_68);
  poVar2 = std::operator<<(local_380,(string *)&local_208);
  std::__cxx11::string::string((string *)&local_1c8,"cx",&local_2e);
  dVar1 = (this->center).x;
  if ((layout->origin & ~BottomLeft) == TopRight) {
    local_48 = (layout->dimensions).width - (dVar1 + (layout->origin_offset).x) * layout->scale;
  }
  else {
    local_48 = (dVar1 + (layout->origin_offset).x) * layout->scale;
  }
  std::__cxx11::string::string((string *)&local_1a8,"",&local_2d);
  attribute<double>(&local_68,&local_1c8,&local_48,&local_1a8);
  poVar2 = std::operator<<(poVar2,(string *)&local_68);
  std::__cxx11::string::string((string *)&local_168,"cy",&local_2c);
  dVar1 = (this->center).y;
  if ((layout->origin | TopRight) == BottomRight) {
    local_40 = (layout->dimensions).height - (dVar1 + (layout->origin_offset).y) * layout->scale;
  }
  else {
    local_40 = (dVar1 + (layout->origin_offset).y) * layout->scale;
  }
  std::__cxx11::string::string((string *)&local_148,"",&local_2b);
  attribute<double>(&local_188,&local_168,&local_40,&local_148);
  poVar2 = std::operator<<(poVar2,(string *)&local_188);
  std::__cxx11::string::string((string *)&local_108,"r",&local_2a);
  local_38 = this->radius * layout->scale;
  std::__cxx11::string::string((string *)&local_e8,"",&local_29);
  attribute<double>(&local_128,&local_108,&local_38,&local_e8);
  poVar2 = std::operator<<(poVar2,(string *)&local_128);
  Fill::toString_abi_cxx11_(&local_c8,&(this->super_Shape).fill,layout);
  poVar2 = std::operator<<(poVar2,(string *)&local_c8);
  Stroke::toString_abi_cxx11_(&local_a8,&(this->super_Shape).stroke,layout);
  poVar2 = std::operator<<(poVar2,(string *)&local_a8);
  std::__cxx11::string::string(local_88,"/>\n",&local_30);
  std::operator<<(poVar2,local_88);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_390);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << elemStart("circle") << attribute("cx", translateX(center.x, layout))
                << attribute("cy", translateY(center.y, layout))
                << attribute("r", translateScale(radius, layout)) << fill.toString(layout)
                << stroke.toString(layout) << emptyElemEnd();
            return ss.str();
        }